

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall rsg::AssignOp::evaluate(AssignOp *this,ExecutionContext *evalCtx)

{
  ValueRange *type;
  pointer pSVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Scalar *extraout_RDX;
  ExecConstValueAccess mask;
  ExecValueAccess dst;
  ExecConstValueAccess src;
  StridedValueAccess<64> local_48;
  StridedValueRead<64> local_38;
  
  (*this->m_lvalueExpr->_vptr_Expression[4])();
  (*this->m_rvalueExpr->_vptr_Expression[4])(this->m_rvalueExpr,evalCtx);
  type = &this->m_valueRange;
  ValueStorage<64>::setStorage(&this->m_value,&type->m_type);
  iVar2 = (*this->m_rvalueExpr->_vptr_Expression[5])();
  local_38.m_type = (VariableType *)CONCAT44(extraout_var,iVar2);
  local_48.super_ConstStridedValueAccess<64>.m_value =
       (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_48.super_ConstStridedValueAccess<64>.m_type = &type->m_type;
  StridedValueAccess<64>::operator=(&local_48,&local_38);
  iVar2 = (*this->m_lvalueExpr->_vptr_Expression[6])();
  dst.super_ConstStridedValueAccess<64>.m_type._4_4_ = extraout_var_00;
  dst.super_ConstStridedValueAccess<64>.m_type._0_4_ = iVar2;
  pSVar1 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  mask = ExecutionContext::getExecutionMask(evalCtx);
  dst.super_ConstStridedValueAccess<64>.m_value = extraout_RDX;
  src.m_value = pSVar1;
  src.m_type = &type->m_type;
  assignMasked(dst,src,mask);
  return;
}

Assistant:

void AssignOp::evaluate (ExecutionContext& evalCtx)
{
	// Evaluate l-value
	m_lvalueExpr->evaluate(evalCtx);

	// Evaluate value
	m_rvalueExpr->evaluate(evalCtx);
	m_value.setStorage(m_valueRange.getType());
	m_value.getValue(m_valueRange.getType()) = m_rvalueExpr->getValue().value();

	// Assign
	assignMasked(m_lvalueExpr->getLValue(), m_value.getValue(m_valueRange.getType()), evalCtx.getExecutionMask());
}